

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

File * File::parse_file_binary(File *__return_storage_ptr__,ifstream *in)

{
  bool bVar1;
  u4 version_00;
  InvalidFile *pIVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  size_type sVar6;
  istreambuf_iterator<char,_std::char_traits<char>_> __last;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  Instruction IVar7;
  vector<vm::Function,_std::allocator<vm::Function>_> local_378;
  vector<vm::Instruction,_std::allocator<vm::Instruction>_> local_360;
  vector<vm::Constant,_std::allocator<vm::Constant>_> local_348;
  undefined1 local_32a;
  allocator<char> local_329;
  string local_328;
  undefined1 local_302;
  allocator<char> local_301;
  string local_300;
  Instruction local_2e0;
  Instruction local_2d0;
  int local_2c0;
  ushort local_2bc;
  undefined1 local_2ba;
  allocator<char> local_2b9;
  int k;
  u2 instructionsCount_1;
  undefined1 local_292;
  allocator<char> local_291;
  string local_290;
  undefined1 local_270 [8];
  Function fun;
  int j_2;
  bool mainFound;
  vector<vm::Function,_std::allocator<vm::Function>_> functions;
  u2 functionsCount;
  Instruction local_218;
  int local_20c;
  undefined1 local_208 [4];
  int j_1;
  vector<vm::Instruction,_std::allocator<vm::Instruction>_> start;
  undefined1 local_1e8 [4];
  u2 instructionsCount;
  double_t local_1c8;
  u4 local_1bc;
  str_t local_1b8;
  u2 local_192;
  undefined1 local_190 [6];
  u2 length;
  Constant constant;
  undefined1 local_158 [4];
  int j;
  vector<vm::Constant,_std::allocator<vm::Constant>_> constants;
  u2 constantsCount;
  u4 version;
  u4 local_10c;
  undefined1 auStack_108 [4];
  u4 magic;
  anon_class_24_3_94a76bc3 readInstruction;
  anon_class_24_3_d3a0271c readString;
  anon_class_24_3_d3a0271c readDouble;
  anon_class_24_3_d3a0271c read4bytes;
  anon_class_24_3_d3a0271c read2bytes;
  anon_class_24_3_d3a0271c readByte;
  size_type bufferSize;
  size_t pos;
  allocator<unsigned_char> local_51;
  undefined1 local_50 [12];
  undefined1 local_40 [12];
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  ifstream *in_local;
  
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in;
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_40,(istream_type *)in);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_50);
  std::allocator<unsigned_char>::allocator(&local_51);
  __last._12_4_ = 0;
  __last._M_sbuf = (streambuf_type *)local_50._0_8_;
  __last._M_c = local_50._8_4_;
  __first._12_4_ = 0;
  __first._M_sbuf = (streambuf_type *)local_40._0_8_;
  __first._M_c = local_40._8_4_;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_30,__first,__last,
             &local_51);
  std::allocator<unsigned_char>::~allocator(&local_51);
  bufferSize = 0;
  readByte.buffer =
       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
       std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  readInstruction.read4bytes = (anon_class_24_3_d3a0271c *)&bufferSize;
  readString.pos = (size_t *)&readByte.buffer;
  _auStack_108 = (anon_class_24_3_d3a0271c *)&read2bytes.buffer;
  readInstruction.readByte = (anon_class_24_3_d3a0271c *)&read4bytes.buffer;
  readInstruction.read2bytes = (anon_class_24_3_d3a0271c *)&readDouble.buffer;
  readString.bufferSize = (size_type *)local_30;
  readString.buffer =
       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)readInstruction.read4bytes;
  readDouble.pos = readString.pos;
  readDouble.bufferSize = (size_type *)local_30;
  readDouble.buffer =
       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)readInstruction.read4bytes;
  read4bytes.pos = readString.pos;
  read4bytes.bufferSize = (size_type *)local_30;
  read4bytes.buffer =
       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)readInstruction.read4bytes;
  read2bytes.pos = readString.pos;
  read2bytes.bufferSize = (size_type *)local_30;
  read2bytes.buffer =
       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)readInstruction.read4bytes;
  readByte.pos = readString.pos;
  readByte.bufferSize = (size_type *)local_30;
  local_10c = parse_file_binary::anon_class_24_3_d3a0271c::operator()(readInstruction.read2bytes);
  if (local_10c != 0x43303a29) {
    constantsCount._0_1_ = 1;
    pIVar2 = (InvalidFile *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&version,"invalid binary file: invalid magic",
               (allocator<char> *)((long)&constantsCount + 1));
    InvalidFile::InvalidFile(pIVar2,(string *)&version);
    constantsCount._0_1_ = 0;
    __cxa_throw(pIVar2,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
  }
  version_00 = parse_file_binary::anon_class_24_3_d3a0271c::operator()
                         ((anon_class_24_3_d3a0271c *)&readDouble.buffer);
  constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_2_ =
       parse_file_binary::anon_class_24_3_d3a0271c::operator()
                 ((anon_class_24_3_d3a0271c *)&read4bytes.buffer);
  std::vector<vm::Constant,_std::allocator<vm::Constant>_>::vector
            ((vector<vm::Constant,_std::allocator<vm::Constant>_> *)local_158);
  for (constant.value.
       super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
       .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
       super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
       super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
       super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
       super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double>._36_4_ = 0;
      (int)constant.value.
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double>._36_4_ <
      (int)(uint)constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._6_2_;
      constant.value.
      super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
      .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
      super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
      super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
      super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
      super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double>._36_4_ =
           constant.value.
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>.
           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double>._36_4_ + 1) {
    vm::Constant::Constant((Constant *)local_190);
    local_190[0] = parse_file_binary::anon_class_24_3_d3a0271c::operator()
                             ((anon_class_24_3_d3a0271c *)&read2bytes.buffer);
    if (local_190[0] == STRING) {
      local_192 = parse_file_binary::anon_class_24_3_d3a0271c::operator()
                            ((anon_class_24_3_d3a0271c *)&read4bytes.buffer);
      parse_file_binary(std::ifstream&)::$_3::operator()[abi_cxx11_
                (&local_1b8,&readInstruction.read4bytes,local_192);
      std::variant<std::__cxx11::string,int,double>::operator=
                ((variant<std::__cxx11::string,int,double> *)&constant,&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
    }
    else if (local_190[0] == INT) {
      local_1bc = parse_file_binary::anon_class_24_3_d3a0271c::operator()
                            ((anon_class_24_3_d3a0271c *)&readDouble.buffer);
      std::variant<std::__cxx11::string,int,double>::operator=
                ((variant<std::__cxx11::string,int,double> *)&constant,(int *)&local_1bc);
    }
    else {
      if (local_190[0] != DOUBLE) {
        start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
        pIVar2 = (InvalidFile *)__cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1e8,"invalid binary file: invalid constant type",
                   (allocator<char> *)
                   ((long)&start.
                           super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        InvalidFile::InvalidFile(pIVar2,(string *)local_1e8);
        start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
        __cxa_throw(pIVar2,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
      }
      local_1c8 = parse_file_binary::anon_class_24_3_d3a0271c::operator()
                            ((anon_class_24_3_d3a0271c *)&readString.buffer);
      std::variant<std::__cxx11::string,int,double>::operator=
                ((variant<std::__cxx11::string,int,double> *)&constant,&local_1c8);
    }
    std::vector<vm::Constant,_std::allocator<vm::Constant>_>::push_back
              ((vector<vm::Constant,_std::allocator<vm::Constant>_> *)local_158,
               (value_type *)local_190);
    vm::Constant::~Constant((Constant *)local_190);
  }
  start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_2_ =
       parse_file_binary::anon_class_24_3_d3a0271c::operator()
                 ((anon_class_24_3_d3a0271c *)&read4bytes.buffer);
  std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::vector
            ((vector<vm::Instruction,_std::allocator<vm::Instruction>_> *)local_208);
  for (local_20c = 0;
      local_20c <
      (int)(uint)start.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage._4_2_; local_20c = local_20c + 1) {
    IVar7 = parse_file_binary::anon_class_24_3_94a76bc3::operator()
                      ((anon_class_24_3_94a76bc3 *)auStack_108);
    local_218 = IVar7;
    std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::push_back
              ((vector<vm::Instruction,_std::allocator<vm::Instruction>_> *)local_208,&local_218);
  }
  functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_2_ =
       parse_file_binary::anon_class_24_3_d3a0271c::operator()
                 ((anon_class_24_3_d3a0271c *)&read4bytes.buffer);
  std::vector<vm::Function,_std::allocator<vm::Function>_>::vector
            ((vector<vm::Function,_std::allocator<vm::Function>_> *)&j_2);
  fun.instructions.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  fun.instructions.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  while( true ) {
    sVar4 = bufferSize;
    if ((int)(uint)functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage._6_2_ <=
        (int)fun.instructions.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage) {
      if ((fun.instructions.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
        local_302 = 1;
        pIVar2 = (InvalidFile *)__cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_300,"invalid binary file: main() not found",&local_301);
        InvalidFile::InvalidFile(pIVar2,&local_300);
        local_302 = 0;
        __cxa_throw(pIVar2,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
      }
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
      if (sVar4 == sVar6) {
        std::vector<vm::Constant,_std::allocator<vm::Constant>_>::vector
                  (&local_348,(vector<vm::Constant,_std::allocator<vm::Constant>_> *)local_158);
        std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::vector
                  (&local_360,(vector<vm::Instruction,_std::allocator<vm::Instruction>_> *)local_208
                  );
        std::vector<vm::Function,_std::allocator<vm::Function>_>::vector
                  (&local_378,(vector<vm::Function,_std::allocator<vm::Function>_> *)&j_2);
        File(__return_storage_ptr__,version_00,&local_348,&local_360,&local_378);
        std::vector<vm::Function,_std::allocator<vm::Function>_>::~vector(&local_378);
        std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::~vector(&local_360);
        std::vector<vm::Constant,_std::allocator<vm::Constant>_>::~vector(&local_348);
        std::vector<vm::Function,_std::allocator<vm::Function>_>::~vector
                  ((vector<vm::Function,_std::allocator<vm::Function>_> *)&j_2);
        std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::~vector
                  ((vector<vm::Instruction,_std::allocator<vm::Instruction>_> *)local_208);
        std::vector<vm::Constant,_std::allocator<vm::Constant>_>::~vector
                  ((vector<vm::Constant,_std::allocator<vm::Constant>_> *)local_158);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
        return __return_storage_ptr__;
      }
      local_32a = 1;
      pIVar2 = (InvalidFile *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_328,"invalid binary file: unused content",&local_329);
      InvalidFile::InvalidFile(pIVar2,&local_328);
      local_32a = 0;
      __cxa_throw(pIVar2,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
    }
    vm::Function::Function((Function *)local_270);
    local_270._0_2_ =
         parse_file_binary::anon_class_24_3_d3a0271c::operator()
                   ((anon_class_24_3_d3a0271c *)&read4bytes.buffer);
    uVar3 = (ulong)(ushort)local_270._0_2_;
    sVar4 = std::vector<vm::Constant,_std::allocator<vm::Constant>_>::size
                      ((vector<vm::Constant,_std::allocator<vm::Constant>_> *)local_158);
    if (sVar4 <= uVar3) {
      local_292 = 1;
      pIVar2 = (InvalidFile *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_290,"invalid binary file: function name not found",&local_291);
      InvalidFile::InvalidFile(pIVar2,&local_290);
      local_292 = 0;
      __cxa_throw(pIVar2,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
    }
    pvVar5 = std::vector<vm::Constant,_std::allocator<vm::Constant>_>::operator[]
                       ((vector<vm::Constant,_std::allocator<vm::Constant>_> *)local_158,
                        (ulong)(ushort)local_270._0_2_);
    if (pvVar5->type != STRING) break;
    pvVar5 = std::vector<vm::Constant,_std::allocator<vm::Constant>_>::operator[]
                       ((vector<vm::Constant,_std::allocator<vm::Constant>_> *)local_158,
                        (ulong)(ushort)local_270._0_2_);
    __lhs = std::get<std::__cxx11::string,std::__cxx11::string,int,double>(&pvVar5->value);
    bVar1 = std::operator==(__lhs,"main");
    if (bVar1) {
      fun.instructions.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    }
    local_270._2_2_ =
         parse_file_binary::anon_class_24_3_d3a0271c::operator()
                   ((anon_class_24_3_d3a0271c *)&read4bytes.buffer);
    local_270._4_2_ =
         parse_file_binary::anon_class_24_3_d3a0271c::operator()
                   ((anon_class_24_3_d3a0271c *)&read4bytes.buffer);
    local_2bc = parse_file_binary::anon_class_24_3_d3a0271c::operator()
                          ((anon_class_24_3_d3a0271c *)&read4bytes.buffer);
    for (local_2c0 = 0; local_2c0 < (int)(uint)local_2bc; local_2c0 = local_2c0 + 1) {
      IVar7 = parse_file_binary::anon_class_24_3_94a76bc3::operator()
                        ((anon_class_24_3_94a76bc3 *)auStack_108);
      local_2e0 = IVar7;
      local_2d0 = IVar7;
      std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::push_back
                ((vector<vm::Instruction,_std::allocator<vm::Instruction>_> *)&fun,&local_2d0);
    }
    std::vector<vm::Function,_std::allocator<vm::Function>_>::push_back
              ((vector<vm::Function,_std::allocator<vm::Function>_> *)&j_2,(value_type *)local_270);
    vm::Function::~Function((Function *)local_270);
    fun.instructions.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ =
         (int)fun.instructions.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
  }
  local_2ba = 1;
  pIVar2 = (InvalidFile *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&k,"invalid binary file: function name not found",&local_2b9);
  InvalidFile::InvalidFile(pIVar2,(string *)&k);
  local_2ba = 0;
  __cxa_throw(pIVar2,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
}

Assistant:

File File::parse_file_binary(std::ifstream& in) {
    // read raw
    const std::vector<unsigned char> buffer(std::istreambuf_iterator<char>(in), {});
    size_t pos = 0;
    const auto bufferSize = buffer.size();
    const auto readByte = [&]() {
        if (pos + 1 > bufferSize) {
            throw InvalidFile("incomplete binary file");
        }
        vm::u1 rtv = static_cast<vm::u1>(buffer[pos]);
        pos += 1;
        return rtv;
    };
    const auto read2bytes = [&] {
        if (pos + 2 > bufferSize) {
            throw InvalidFile("incomplete binary file");
        }
        vm::u2 rtv = static_cast<vm::u2>(
            (buffer[pos] << 8) | buffer[pos+1]
        );
        pos += 2;
        return rtv;
    };
    const auto read4bytes = [&]() {
        if (pos + 4 > bufferSize) {
            throw InvalidFile("incomplete binary file");
        }
        vm::u4 rtv = static_cast<vm::u4>(
            (buffer[pos] << 24) | (buffer[pos+1] << 16) | (buffer[pos+2] << 8) | buffer[pos+3]
        );
        pos += 4;
        return rtv;
    };
    const auto readDouble = [&]() {
        if (pos + 8 > bufferSize) {
            throw InvalidFile("invalid binary file: incomplete double constant");
        }
        union {
            vm::double_t d;
            unsigned char b[8];
        } rtv;
        for (int i = 7; i >= 0; --i) {
            rtv.b[i] = buffer[pos++];
        }
        return rtv.d;
    };
    const auto readString = [&](vm::u2 length) {
        if (pos + length > bufferSize) {
            throw InvalidFile("invalid binary file: incomplete string constant");
        }
        vm::str_t rtv;
        while (length-- ) {
            rtv += buffer[pos++];
        }
        return rtv;
    };
    const auto readInstruction = [&]() {
        vm::Instruction ins;
        ins.op = static_cast<vm::OpCode>(readByte());
        if (vm::nameOfOpCode.count(ins.op) == 0) {
            throw InvalidFile("invalid binary file: invalid opcode");
        }
        if (auto it = vm::paramSizeOfOpCode.find(ins.op); it != vm::paramSizeOfOpCode.end()) {
            auto paramSizes = it->second;
            switch (paramSizes[0]) {
            case 1: ins.x = readByte(); break;
            case 2: ins.x = read2bytes(); break;
            case 4: ins.x = read4bytes(); break;
            default: assert(("unexpected error", false));
            }
            if (paramSizes.size() == 2) {
                ins.y = read4bytes();
            }
        }
        return ins;
    };

    // parse magic
    auto magic = read4bytes(); 
    if (magic != magic_v) {
        throw InvalidFile("invalid binary file: invalid magic");
    }

    // parse version
    auto version = read4bytes(); 

    // parse constants
    auto constantsCount = read2bytes();
    std::vector<vm::Constant> constants;
    for (int j = 0; j < constantsCount; ++j) {
        vm::Constant constant;
        constant.type = static_cast<vm::Constant::Type>(readByte());
        switch (constant.type)
        {
        case vm::Constant::Type::STRING: {
            auto length = read2bytes();
            constant.value = std::move(readString(length));
        } break;
        case vm::Constant::Type::INT: {
            constant.value = static_cast<vm::int_t>(read4bytes());
        } break;
        case vm::Constant::Type::DOUBLE: {
            constant.value = readDouble();
        } break;
        default:
            throw InvalidFile("invalid binary file: invalid constant type");
        }
        constants.push_back(std::move(constant));
    }

    // parse start
    auto instructionsCount = read2bytes();
    std::vector<vm::Instruction> start;
    for (int j = 0; j < instructionsCount; ++j) {
        start.push_back(std::move(readInstruction()));
    }

    // parse functions
    auto functionsCount = read2bytes();
    std::vector<vm::Function> functions;
    bool mainFound = false;
    for (int j = 0; j < functionsCount; ++j) {
        vm::Function fun;
        fun.nameIndex = read2bytes();
        if (fun.nameIndex >= constants.size()) {
            throw InvalidFile("invalid binary file: function name not found");
        }
        if (constants[fun.nameIndex].type != vm::Constant::Type::STRING) {
            throw InvalidFile("invalid binary file: function name not found");
        }
        if (std::get<vm::str_t>(constants[fun.nameIndex].value) == "main") {
            mainFound = true;
        }
        fun.paramSize = read2bytes();
        fun.level = read2bytes();
        auto instructionsCount = read2bytes();
        for (int k = 0; k < instructionsCount; ++k) {
            fun.instructions.push_back(std::move(readInstruction()));
        }
        functions.push_back(std::move(fun));
    }

    if (!mainFound) {
        throw InvalidFile("invalid binary file: main() not found");
    }

    if (pos != buffer.size()) {
        throw InvalidFile("invalid binary file: unused content");
    }

    return File{version, std::move(constants), std::move(start), std::move(functions)};
}